

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

void logdirs_reopen(void)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  tmaxflag = 0;
  taia_now(&now);
  lVar3 = 0;
  bVar1 = false;
  for (uVar4 = 0; uVar4 < dirn; uVar4 = uVar4 + 1) {
    logdir_close((logdir *)((long)&dir->fddir + lVar3));
    uVar2 = logdir_open((logdir *)((long)&dir->fddir + lVar3),fndir[uVar4]);
    if (uVar2 != 0) {
      bVar1 = true;
    }
    lVar3 = lVar3 + 0xf0;
  }
  if (bVar1) {
    return;
  }
  fatalx("no functional log directories.");
  return;
}

Assistant:

void logdirs_reopen(void) {
  int l;
  int ok =0;

  tmaxflag =0;
  taia_now(&now);
  for (l =0; l < dirn; ++l) {
    logdir_close(&dir[l]);
    if (logdir_open(&dir[l], fndir[l])) ok =1;
  }
  if (! ok) fatalx("no functional log directories.");
}